

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall crnlib::crn_comp::~crn_comp(crn_comp *this)

{
  itexture_comp *in_RDI;
  static_huffman_data_model *in_stack_ffffffffffffff30;
  task_pool *this_00;
  dxt_hc *in_stack_ffffffffffffff40;
  itexture_comp *local_a8;
  itexture_comp *local_90;
  itexture_comp *local_78;
  itexture_comp *local_60;
  itexture_comp *local_48;
  itexture_comp *local_30;
  itexture_comp *local_10;
  
  in_RDI->_vptr_itexture_comp = (_func_int **)&PTR__crn_comp_002817e8;
  vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_ffffffffffffff30);
  vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_ffffffffffffff30);
  vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_ffffffffffffff30);
  vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_ffffffffffffff30);
  vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_ffffffffffffff30);
  local_10 = in_RDI + 0x420;
  do {
    local_10 = local_10 + -2;
    vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_ffffffffffffff30);
  } while (local_10 != in_RDI + 0x400);
  local_30 = in_RDI + 0x400;
  do {
    local_30 = local_30 + -7;
    static_huffman_data_model::~static_huffman_data_model(in_stack_ffffffffffffff30);
  } while (local_30 != in_RDI + 0x3f2);
  local_48 = in_RDI + 0x3f2;
  do {
    local_48 = local_48 + -2;
    symbol_histogram::~symbol_histogram((symbol_histogram *)0x1c7826);
  } while (local_48 != in_RDI + 0x3ee);
  local_60 = in_RDI + 0x3ee;
  do {
    local_60 = local_60 + -2;
    vector<unsigned_short>::~vector((vector<unsigned_short> *)in_stack_ffffffffffffff30);
  } while (local_60 != in_RDI + 0x3ea);
  local_78 = in_RDI + 0x3ea;
  do {
    local_78 = local_78 + -7;
    static_huffman_data_model::~static_huffman_data_model(in_stack_ffffffffffffff30);
  } while (local_78 != in_RDI + 0x3dc);
  local_90 = in_RDI + 0x3dc;
  do {
    local_90 = local_90 + -2;
    symbol_histogram::~symbol_histogram((symbol_histogram *)0x1c78f8);
  } while (local_90 != in_RDI + 0x3d8);
  local_a8 = in_RDI + 0x3d8;
  do {
    local_a8 = local_a8 + -2;
    vector<unsigned_short>::~vector((vector<unsigned_short> *)in_stack_ffffffffffffff30);
  } while (local_a8 != in_RDI + 0x3d4);
  static_huffman_data_model::~static_huffman_data_model(in_stack_ffffffffffffff30);
  symbol_histogram::~symbol_histogram((symbol_histogram *)0x1c7977);
  dxt_hc::~dxt_hc(in_stack_ffffffffffffff40);
  vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_ffffffffffffff30);
  vector<crnlib::dxt_hc::selector_indices_details>::~vector
            ((vector<crnlib::dxt_hc::selector_indices_details> *)in_stack_ffffffffffffff30);
  vector<crnlib::dxt_hc::endpoint_indices_details>::~vector
            ((vector<crnlib::dxt_hc::endpoint_indices_details> *)in_stack_ffffffffffffff30);
  vector<unsigned_long_long>::~vector((vector<unsigned_long_long> *)in_stack_ffffffffffffff30);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_ffffffffffffff30);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_ffffffffffffff30);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_ffffffffffffff30);
  vector<crnlib::crn_comp::level_details>::~vector
            ((vector<crnlib::crn_comp::level_details> *)in_stack_ffffffffffffff30);
  this_00 = (task_pool *)(in_RDI + 0x29a);
  do {
    this_00 = (task_pool *)(this_00[-1].m_threads + 0xf);
    image<crnlib::color_quad<unsigned_char,_int>_>::~image
              ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x1c7a5c);
  } while (this_00 != (task_pool *)(in_RDI + 0x5a));
  task_pool::~task_pool(this_00);
  itexture_comp::~itexture_comp(in_RDI);
  return;
}

Assistant:

crn_comp::~crn_comp() {
}